

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

ItemList *
Lib::UniquePersistentIterator<Kernel::FirstOrderSubtermIt>::getUniqueItemList
          (FirstOrderSubtermIt *inn,size_t *sizeRef)

{
  byte bVar1;
  long *in_RSI;
  long *in_RDI;
  T el;
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  ItemList *res;
  Term *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  *in_stack_ffffffffffffffe0;
  ItemList *local_18;
  
  local_18 = (ItemList *)0x0;
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled((Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
              *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  *in_RSI = 0;
  while (bVar1 = (**(code **)(*in_RDI + 0x10))(), (bVar1 & 1) != 0) {
    (**(code **)(*in_RDI + 0x18))();
    Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::operator->((Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  *)0x8525f7);
    in_stack_ffffffffffffffa7 =
         DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                   ((DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
    if ((bool)in_stack_ffffffffffffffa7) {
      List<Kernel::Term_*>::push
                ((Term *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                 (List<Kernel::Term_*> **)in_stack_ffffffffffffff98);
      *in_RSI = *in_RSI + 1;
    }
  }
  Recycled<Lib::DHSet<Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(in_stack_ffffffffffffffe0);
  return local_18;
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }